

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
AdapterPromiseNode<kj::AsyncCapabilityStream::ReadResult,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead>
::reject(AdapterPromiseNode<kj::AsyncCapabilityStream::ReadResult,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead>
         *this,Exception *exception)

{
  Exception *exception_00;
  ExceptionOr<kj::AsyncCapabilityStream::ReadResult> local_1c8;
  Exception *local_18;
  Exception *exception_local;
  AdapterPromiseNode<kj::AsyncCapabilityStream::ReadResult,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead>
  *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = exception;
    exception_local = (Exception *)this;
    exception_00 = mv<kj::Exception>(exception);
    ExceptionOr<kj::AsyncCapabilityStream::ReadResult>::ExceptionOr(&local_1c8,false,exception_00);
    ExceptionOr<kj::AsyncCapabilityStream::ReadResult>::operator=(&this->result,&local_1c8);
    ExceptionOr<kj::AsyncCapabilityStream::ReadResult>::~ExceptionOr(&local_1c8);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }